

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::setFixedHeight(QWidget *this,int h)

{
  ushort uVar1;
  QWidgetPrivate *this_00;
  long lVar2;
  QWExtra *pQVar3;
  int iVar4;
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  QWidgetPrivate::createExtra(this_00);
  lVar2 = *(long *)(*(long *)&this->field_0x8 + 0x78);
  if (lVar2 == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = *(int *)(lVar2 + 0x60);
  }
  uVar1 = *(ushort *)
           &((this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>.
             _M_t.super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->field_0x7c;
  setMinimumSize(this,iVar4,h);
  lVar2 = *(long *)(*(long *)&this->field_0x8 + 0x78);
  if (lVar2 == 0) {
    iVar4 = 0xffffff;
  }
  else {
    iVar4 = *(int *)(lVar2 + 0x68);
  }
  setMaximumSize(this,iVar4,h);
  pQVar3 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  *(ushort *)&pQVar3->field_0x7c =
       ((ushort)*(undefined4 *)&pQVar3->field_0x7c & 0xfffc) + (uVar1 & 1) + 2;
  pQVar3 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  *(ushort *)&pQVar3->field_0x7c =
       ((ushort)*(undefined4 *)&pQVar3->field_0x7c & 0xfff3) + (uVar1 & 4) + 8;
  return;
}

Assistant:

void QWidget::setFixedHeight(int h)
{
    Q_D(QWidget);
    d->createExtra();
    uint explMin = d->extra->explicitMinSize | Qt::Vertical;
    uint explMax = d->extra->explicitMaxSize | Qt::Vertical;
    setMinimumSize(minimumSize().width(), h);
    setMaximumSize(maximumSize().width(), h);
    d->extra->explicitMinSize = explMin;
    d->extra->explicitMaxSize = explMax;
}